

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  int iVar3;
  GetterXsYs<unsigned_short> *pGVar4;
  TransformerLogLin *pTVar5;
  ImPlotPlot *pIVar6;
  GetterXsYRef<unsigned_short> *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawIdx *pIVar9;
  undefined1 auVar10 [12];
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  long lVar14;
  ushort uVar15;
  ImDrawIdx IVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  double dVar22;
  double dVar23;
  ImVec2 IVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar39 [16];
  
  pIVar11 = GImPlot;
  pGVar4 = this->Getter1;
  pTVar5 = this->Transformer;
  iVar13 = pGVar4->Count;
  lVar14 = (long)(((pGVar4->Offset + prim + 1) % iVar13 + iVar13) % iVar13) * (long)pGVar4->Stride;
  uVar15 = *(ushort *)((long)pGVar4->Ys + lVar14);
  dVar22 = log10((double)*(ushort *)((long)pGVar4->Xs + lVar14) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar12 = GImPlot;
  pIVar6 = pIVar11->CurrentPlot;
  dVar2 = (pIVar6->XAxis).Range.Min;
  iVar13 = pTVar5->YAxis;
  pGVar7 = this->Getter2;
  pTVar5 = this->Transformer;
  iVar3 = pGVar7->Count;
  IVar1 = pIVar11->PixelRange[iVar13].Min;
  fVar25 = (float)(pIVar11->Mx *
                   (((double)(float)(dVar22 / pIVar11->LogDenX) *
                     ((pIVar6->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar1.x);
  fVar27 = (float)(pIVar11->My[iVar13] * ((double)uVar15 - pIVar6->YAxis[iVar13].Range.Min) +
                  (double)IVar1.y);
  dVar2 = pGVar7->YRef;
  dVar23 = log10((double)*(ushort *)
                          ((long)pGVar7->Xs +
                          (long)(((prim + 1 + pGVar7->Offset) % iVar3 + iVar3) % iVar3) *
                          (long)pGVar7->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar12->CurrentPlot;
  dVar22 = (pIVar6->XAxis).Range.Min;
  iVar13 = pTVar5->YAxis;
  IVar1 = pIVar12->PixelRange[iVar13].Min;
  IVar24.x = (float)(pIVar12->Mx *
                     (((double)(float)(dVar23 / pIVar12->LogDenX) *
                       ((pIVar6->XAxis).Range.Max - dVar22) + dVar22) - dVar22) + (double)IVar1.x);
  IVar24.y = (float)(pIVar12->My[iVar13] * (dVar2 - pIVar6->YAxis[iVar13].Range.Min) +
                    (double)IVar1.y);
  fVar26 = (this->P12).x;
  fVar28 = (this->P12).y;
  fVar30 = (this->P11).y;
  fVar35 = (this->P11).x;
  uVar20 = -(uint)(fVar30 < fVar28);
  fVar29 = (float)(~-(uint)(fVar26 <= fVar35) & (uint)fVar26 |
                  (uint)fVar35 & -(uint)(fVar26 <= fVar35));
  fVar31 = (float)(~-(uint)(fVar28 <= fVar30) & (uint)fVar28 |
                  (uint)fVar30 & -(uint)(fVar28 <= fVar30));
  fVar34 = (float)(~-(uint)(fVar35 < fVar26) & (uint)fVar26 |
                  (uint)fVar35 & -(uint)(fVar35 < fVar26));
  fVar43 = (float)(~uVar20 & (uint)fVar28 | (uint)fVar30 & uVar20);
  uVar17 = -(uint)(fVar25 <= fVar29);
  uVar18 = -(uint)(fVar27 <= fVar31);
  uVar19 = -(uint)(fVar34 < fVar25);
  uVar21 = -(uint)(fVar43 < fVar27);
  fVar29 = (float)(~uVar17 & (uint)fVar25 | (uint)fVar29 & uVar17);
  fVar31 = (float)(~uVar18 & (uint)fVar27 | (uint)fVar31 & uVar18);
  fVar34 = (float)(~uVar19 & (uint)fVar25 | (uint)fVar34 & uVar19);
  fVar43 = (float)(~uVar21 & (uint)fVar27 | (uint)fVar43 & uVar21);
  uVar17 = -(uint)(IVar24.x <= fVar29);
  uVar18 = -(uint)(IVar24.y <= fVar31);
  uVar19 = -(uint)(fVar34 < IVar24.x);
  uVar21 = -(uint)(fVar43 < IVar24.y);
  auVar33._0_4_ = (uint)fVar29 & uVar17;
  auVar33._4_4_ = (uint)fVar31 & uVar18;
  auVar33._8_4_ = (uint)fVar34 & uVar19;
  auVar33._12_4_ = (uint)fVar43 & uVar21;
  auVar40._0_4_ = ~uVar17 & (uint)IVar24.x;
  auVar40._4_4_ = ~uVar18 & (uint)IVar24.y;
  auVar40._8_4_ = ~uVar19 & (uint)IVar24.x;
  auVar40._12_4_ = ~uVar21 & (uint)IVar24.y;
  auVar40 = auVar40 | auVar33;
  fVar29 = (cull_rect->Min).y;
  auVar42._4_4_ = -(uint)(fVar29 < auVar40._4_4_);
  auVar42._0_4_ = -(uint)((cull_rect->Min).x < auVar40._0_4_);
  auVar10._4_8_ = auVar40._8_8_;
  auVar10._0_4_ = -(uint)(auVar40._4_4_ < fVar29);
  auVar41._0_8_ = auVar10._0_8_ << 0x20;
  auVar41._8_4_ = -(uint)(auVar40._8_4_ < (cull_rect->Max).x);
  auVar41._12_4_ = -(uint)(auVar40._12_4_ < (cull_rect->Max).y);
  auVar42._8_8_ = auVar41._8_8_;
  iVar13 = movmskps((int)cull_rect,auVar42);
  if (iVar13 == 0xf) {
    fVar31 = fVar27 * fVar35 - fVar30 * fVar25;
    fVar34 = IVar24.y * fVar26 - fVar28 * IVar24.x;
    fVar29 = fVar28 - IVar24.y;
    auVar36._4_4_ = fVar29;
    auVar36._0_4_ = fVar29;
    auVar36._8_4_ = fVar29;
    auVar36._12_4_ = fVar29;
    auVar37._4_12_ = auVar36._4_12_;
    auVar37._0_4_ = fVar29 * (fVar35 - fVar25) - (fVar30 - fVar27) * (fVar26 - IVar24.x);
    auVar32._0_4_ = fVar31 * (fVar26 - IVar24.x) - fVar34 * (fVar35 - fVar25);
    auVar32._4_4_ = fVar31 * fVar29 - fVar34 * (fVar30 - fVar27);
    auVar32._8_4_ = fVar27 * 0.0 - IVar24.y * 0.0;
    auVar32._12_4_ = fVar27 * 0.0 - IVar24.y * 0.0;
    auVar39._0_8_ = auVar37._0_8_;
    auVar39._8_4_ = fVar29;
    auVar39._12_4_ = fVar29;
    auVar38._8_8_ = auVar39._8_8_;
    auVar38._4_4_ = auVar37._0_4_;
    auVar38._0_4_ = auVar37._0_4_;
    auVar33 = divps(auVar32,auVar38);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = this->Col;
    pIVar8[1].pos.x = fVar25;
    pIVar8[1].pos.y = fVar27;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = this->Col;
    pIVar8[2].pos = auVar33._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = this->Col;
    pIVar8[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = this->Col;
    pIVar8[4].pos = IVar24;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar8 + 5;
    uVar17 = DrawList->_VtxCurrentIdx;
    pIVar9 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar17;
    *pIVar9 = IVar16;
    uVar15 = (byte)((byte)uVar20 & IVar24.y < fVar27 | -(fVar28 < fVar30) & -(fVar27 < IVar24.y)) &
             1;
    pIVar9[1] = IVar16 + uVar15 + 1;
    pIVar9[2] = IVar16 + 3;
    pIVar9[3] = IVar16 + 1;
    pIVar9[4] = (uVar15 ^ 3) + IVar16;
    pIVar9[5] = IVar16 + 4;
    DrawList->_IdxWritePtr = pIVar9 + 6;
    DrawList->_VtxCurrentIdx = uVar17 + 5;
  }
  (this->P11).x = fVar25;
  (this->P11).y = fVar27;
  (this->P12).x = IVar24.x;
  (this->P12).y = IVar24.y;
  return (char)iVar13 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }